

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_signal_ports.cpp
# Opt level: O0

void __thiscall sc_core::sc_in<sc_dt::sc_logic>::end_of_elaboration(sc_in<sc_dt::sc_logic> *this)

{
  sc_trace_params *psVar1;
  size_type sVar2;
  reference ppsVar3;
  long lVar4;
  sc_in<sc_dt::sc_logic> *tf;
  long *in_RDI;
  in_if_type *iface;
  sc_trace_params *p;
  int i;
  sc_trace_file *object;
  sc_in<sc_dt::sc_logic> *in_stack_ffffffffffffffe0;
  int local_c;
  
  if (in_RDI[0x13] != 0) {
    local_c = 0;
    while( true ) {
      sVar2 = std::vector<sc_core::sc_trace_params_*,_std::allocator<sc_core::sc_trace_params_*>_>::
              size((vector<sc_core::sc_trace_params_*,_std::allocator<sc_core::sc_trace_params_*>_>
                    *)in_RDI[0x13]);
      if ((int)sVar2 <= local_c) break;
      ppsVar3 = std::vector<sc_core::sc_trace_params_*,_std::allocator<sc_core::sc_trace_params_*>_>
                ::operator[]((vector<sc_core::sc_trace_params_*,_std::allocator<sc_core::sc_trace_params_*>_>
                              *)in_RDI[0x13],(long)local_c);
      psVar1 = *ppsVar3;
      lVar4 = (**(code **)(*in_RDI + 0x78))();
      if (lVar4 == 0) {
        tf = (sc_in<sc_dt::sc_logic> *)0x0;
      }
      else {
        tf = (sc_in<sc_dt::sc_logic> *)
             __dynamic_cast(lVar4,&sc_interface::typeinfo,
                            &sc_signal_in_if<sc_dt::sc_logic>::typeinfo,0xffffffffffffffff);
      }
      object = psVar1->tf;
      in_stack_ffffffffffffffe0 = tf;
      (*(tf->super_sc_port<sc_core::sc_signal_in_if<sc_dt::sc_logic>,_1,_(sc_core::sc_port_policy)0>
        ).super_sc_port_b<sc_core::sc_signal_in_if<sc_dt::sc_logic>_>.super_sc_port_base.
        super_sc_object._vptr_sc_object[7])();
      sc_core::sc_trace((sc_trace_file *)tf,(sc_logic *)object,(string *)0x238aba);
      local_c = local_c + 1;
    }
    remove_traces(in_stack_ffffffffffffffe0);
  }
  return;
}

Assistant:

void
sc_in<sc_dt::sc_logic>::end_of_elaboration()
{
    if( m_traces != 0 ) {
	for( int i = 0; i < (int)m_traces->size(); ++ i ) {
	    sc_trace_params* p = (*m_traces)[i];
	    in_if_type* iface = dynamic_cast<in_if_type*>( get_interface() );
	    sc_trace( p->tf, iface->read(), p->name );
	}
	remove_traces();
    }
}